

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> * __thiscall
bssl::InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::PushBack
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this,
          unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *val)

{
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *puVar1;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> local_28;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *local_20;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *ret;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *val_local;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this_local;
  
  ret = val;
  val_local = (unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)this;
  std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::unique_ptr(&local_28,val);
  puVar1 = TryPushBack(this,&local_28);
  std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  if (puVar1 == (unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)0x0) {
    local_20 = puVar1;
    abort();
  }
  return puVar1;
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }